

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

typed_address<pstore::trailer>
pstore::database::get_footer_pos<pstore::file::in_memory>(in_memory *file)

{
  bool bVar1;
  type header_storage;
  string sStack_68;
  header local_48;
  
  local_48.crc = 0;
  local_48.unused1 = 0;
  local_48.footer_pos._M_i.a_.a_ = (typed_address<pstore::trailer>)(address)0x0;
  local_48.a.id.data_._M_elems[0] = '\0';
  local_48.a.id.data_._M_elems[1] = '\0';
  local_48.a.id.data_._M_elems[2] = '\0';
  local_48.a.id.data_._M_elems[3] = '\0';
  local_48.a.id.data_._M_elems[4] = '\0';
  local_48.a.id.data_._M_elems[5] = '\0';
  local_48.a.id.data_._M_elems[6] = '\0';
  local_48.a.id.data_._M_elems[7] = '\0';
  local_48.a.id.data_._M_elems[8] = '\0';
  local_48.a.id.data_._M_elems[9] = '\0';
  local_48.a.id.data_._M_elems[10] = '\0';
  local_48.a.id.data_._M_elems[0xb] = '\0';
  local_48.a.id.data_._M_elems[0xc] = '\0';
  local_48.a.id.data_._M_elems[0xd] = '\0';
  local_48.a.id.data_._M_elems[0xe] = '\0';
  local_48.a.id.data_._M_elems[0xf] = '\0';
  local_48.a.signature1._M_elems[0] = '\0';
  local_48.a.signature1._M_elems[1] = '\0';
  local_48.a.signature1._M_elems[2] = '\0';
  local_48.a.signature1._M_elems[3] = '\0';
  local_48.a.signature2 = 0;
  local_48.a.version._M_elems[0] = 0;
  local_48.a.version._M_elems[1] = 0;
  local_48.a.header_size = 0;
  pstore::file::in_memory::seek(file,0);
  pstore::file::file_base::read<pstore::header,void>(&file->super_file_base,&local_48);
  if ((local_48.a.signature1._M_elems != (_Type)0x72745370) || (local_48.a.signature2 != 0x507ffff))
  {
    pstore::file::in_memory::path_abi_cxx11_(&sStack_68,file);
    raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&sStack_68);
  }
  if (((local_48.a.header_size == 0x30) && (local_48.a.version._M_elems[0] == 1)) &&
     (local_48.a.version._M_elems[1] == 0xd)) {
    bVar1 = header::is_valid(&local_48);
    if (!bVar1) {
      pstore::file::in_memory::path_abi_cxx11_(&sStack_68,file);
      raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&sStack_68);
    }
    if (((0x3f < (ulong)local_48.footer_pos._M_i.a_.a_) && (0xaf < file->eof_)) &&
       ((ulong)local_48.footer_pos._M_i.a_.a_ <= file->eof_ - 0x70)) {
      return (typed_address<pstore::trailer>)(address)local_48.footer_pos._M_i.a_.a_;
    }
    pstore::file::in_memory::path_abi_cxx11_(&sStack_68,file);
    raise<pstore::error_code,std::__cxx11::string>(header_corrupt,&sStack_68);
  }
  pstore::file::in_memory::path_abi_cxx11_(&sStack_68,file);
  raise<pstore::error_code,std::__cxx11::string>(header_version_mismatch,&sStack_68);
}

Assistant:

auto database::get_footer_pos (File & file) -> typed_address<trailer> {
        static_assert (std::is_base_of<file::file_base, File>::value,
                       "File type must be derived from file::file_base");
        PSTORE_ASSERT (file.is_open ());

        std::aligned_storage<sizeof (header), alignof (header)>::type header_storage{};
        auto h = reinterpret_cast<header *> (&header_storage);
        file.seek (0);
        file.read (h);

        auto const dtor = [] (header * const p) { p->~header (); };
        std::unique_ptr<header, decltype (dtor)> deleter (h, dtor);

#if PSTORE_SIGNATURE_CHECKS_ENABLED
        if (h->a.signature1 != header::file_signature1 ||
            h->a.signature2 != header::file_signature2) {
            raise (error_code::header_corrupt, file.path ());
        }
#endif
        if (h->a.header_size != sizeof (class header) || h->a.version[0] != header::major_version ||
            h->a.version[1] != header::minor_version) {
            raise (error_code::header_version_mismatch, file.path ());
        }
        if (!h->is_valid ()) {
            raise (pstore::error_code::header_corrupt, file.path ());
        }

        typed_address<trailer> const result = h->footer_pos.load ();
        std::uint64_t const footer_offset = result.absolute ();
        std::uint64_t const file_size = file.size ();
        if (footer_offset < leader_size || file_size < leader_size + sizeof (trailer) ||
            footer_offset > file_size - sizeof (trailer)) {
            raise (error_code::header_corrupt, file.path ());
        }
        return result;
    }